

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.cxx
# Opt level: O1

void __thiscall
cmExternalMakefileProjectGeneratorFactory::cmExternalMakefileProjectGeneratorFactory
          (cmExternalMakefileProjectGeneratorFactory *this,string *n,string *doc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  this->_vptr_cmExternalMakefileProjectGeneratorFactory =
       (_func_int **)&PTR__cmExternalMakefileProjectGeneratorFactory_0088c930;
  (this->Aliases).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Aliases).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Aliases).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &(this->Name).field_2;
  (this->Name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (n->_M_dataplus)._M_p;
  paVar2 = &n->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&n->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Name).field_2 + 8) = uVar4;
  }
  else {
    (this->Name)._M_dataplus._M_p = pcVar3;
    (this->Name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->Name)._M_string_length = n->_M_string_length;
  (n->_M_dataplus)._M_p = (pointer)paVar2;
  n->_M_string_length = 0;
  (n->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->Documentation).field_2;
  (this->Documentation)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (doc->_M_dataplus)._M_p;
  paVar2 = &doc->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&doc->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Documentation).field_2 + 8) = uVar4;
  }
  else {
    (this->Documentation)._M_dataplus._M_p = pcVar3;
    (this->Documentation).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->Documentation)._M_string_length = doc->_M_string_length;
  (doc->_M_dataplus)._M_p = (pointer)paVar2;
  doc->_M_string_length = 0;
  (doc->field_2)._M_local_buf[0] = '\0';
  (this->SupportedGlobalGenerators).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SupportedGlobalGenerators).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SupportedGlobalGenerators).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

cmExternalMakefileProjectGeneratorFactory::
  cmExternalMakefileProjectGeneratorFactory(std::string n, std::string doc)
  : Name(std::move(n))
  , Documentation(std::move(doc))
{
}